

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,CompiledModule *module)

{
  Reader declId;
  Which WVar1;
  uint uVar2;
  uint32_t uVar3;
  Reader *__return_storage_ptr__;
  uint64_t uVar4;
  size_t sVar5;
  Impl *this_00;
  size_t in_RCX;
  ArrayPtr<const_char> AVar6;
  StringPtr declName;
  ArrayPtr<const_char> local_158;
  undefined1 local_148 [8];
  Reader name;
  Reader local_108;
  Reader local_d8;
  Reader local_a8;
  ArrayPtr<const_char> local_78;
  char *local_68;
  char *pcStack_60;
  Reader local_50;
  CompiledModule *local_18;
  CompiledModule *module_local;
  Node *this_local;
  
  local_18 = module;
  module_local = (CompiledModule *)this;
  Resolver::Resolver(&this->super_Resolver);
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_00d92f90;
  this->module = local_18;
  kj::Maybe<capnp::compiler::Compiler::Node_&>::Maybe(&this->parent);
  __return_storage_ptr__ = &this->declaration;
  CompiledModule::getParsedFile(&local_50,local_18);
  ParsedFile::Reader::getRoot(__return_storage_ptr__,&local_50);
  Declaration::Reader::getName(&local_a8,__return_storage_ptr__);
  local_78 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_a8);
  local_68 = local_78.ptr;
  pcStack_60 = (char *)local_78.size_;
  Declaration::Reader::getId(&local_d8,__return_storage_ptr__);
  declId._reader.capTable = local_d8._reader.capTable;
  declId._reader.segment = local_d8._reader.segment;
  declId._reader.data = local_d8._reader.data;
  declId._reader.pointers = local_d8._reader.pointers;
  declId._reader.dataSize = local_d8._reader.dataSize;
  declId._reader.pointerCount = local_d8._reader.pointerCount;
  declId._reader._38_2_ = local_d8._reader._38_2_;
  declId._reader.nestingLimit = local_d8._reader.nestingLimit;
  declId._reader._44_4_ = local_d8._reader._44_4_;
  declName.content.size_ = in_RCX;
  declName.content.ptr = pcStack_60;
  uVar4 = generateId((Node *)0x0,(uint64_t)local_68,declName,declId);
  this->id = uVar4;
  AVar6 = (ArrayPtr<const_char>)CompiledModule::getSourceName(local_18);
  (this->displayName).content = AVar6;
  WVar1 = Declaration::Reader::which(__return_storage_ptr__);
  this->kind = WVar1;
  Declaration::Reader::getParameters(&local_108,__return_storage_ptr__);
  uVar2 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                    (&local_108);
  this->genericParamCount = uVar2;
  this->isBuiltin = false;
  Content::Content(&this->guardedContent);
  this->inGetContent = false;
  kj::Maybe<capnp::schema::Node::Reader>::Maybe(&this->loadedFinalSchema);
  Declaration::Reader::getName((Reader *)local_148,&this->declaration);
  local_158 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)local_148);
  sVar5 = kj::StringPtr::size((StringPtr *)&local_158);
  if (sVar5 == 0) {
    uVar3 = Declaration::Reader::getStartByte(&this->declaration);
    this->startByte = uVar3;
    uVar3 = Declaration::Reader::getEndByte(&this->declaration);
    this->endByte = uVar3;
  }
  else {
    uVar3 = LocatedText::Reader::getStartByte((Reader *)local_148);
    this->startByte = uVar3;
    uVar3 = LocatedText::Reader::getEndByte((Reader *)local_148);
    this->endByte = uVar3;
  }
  this_00 = CompiledModule::getCompiler(local_18);
  uVar4 = Compiler::Impl::addNode(this_00,this->id,this);
  this->id = uVar4;
  return;
}

Assistant:

Compiler::Node::Node(CompiledModule& module)
    : module(&module),
      parent(kj::none),
      declaration(module.getParsedFile().getRoot()),
      id(generateId(0, declaration.getName().getValue(), declaration.getId())),
      displayName(module.getSourceName()),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module.getCompiler().addNode(id, *this);
}